

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::synonym(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  char cVar1;
  uint uVar2;
  uint uVar3;
  Definition *pDVar4;
  size_type sVar5;
  int __fd;
  string *dst;
  char cVar6;
  string *__range5;
  Cell index;
  string newWord;
  string currentWord;
  Definition definition;
  
  bl(this);
  word(this);
  count(this);
  this_00 = &this->dStack;
  uVar2 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  uVar3 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  if (uVar2 != 0) {
    newWord._M_dataplus._M_p = (pointer)&newWord.field_2;
    newWord._M_string_length = 0;
    newWord.field_2._M_local_buf[0] = '\0';
    dst = &newWord;
    moveFromDataSpace(this,dst,uVar3,(ulong)uVar2);
    __fd = (int)dst;
    bl(this);
    word(this);
    dup(this,__fd);
    count(this);
    uVar2 = ForthStack<unsigned_int>::getTop(this_00);
    ForthStack<unsigned_int>::pop(this_00);
    uVar3 = ForthStack<unsigned_int>::getTop(this_00);
    ForthStack<unsigned_int>::pop(this_00);
    if (uVar2 != 0) {
      currentWord._M_dataplus._M_p = (pointer)&currentWord.field_2;
      currentWord._M_string_length = 0;
      currentWord.field_2._M_local_buf[0] = '\0';
      moveFromDataSpace(this,&currentWord,uVar3,(ulong)uVar2);
      find(this);
      uVar2 = ForthStack<unsigned_int>::getTop(this_00);
      ForthStack<unsigned_int>::pop(this_00);
      if (uVar2 == 0) {
        ForthStack<unsigned_int>::pop(this_00);
      }
      else {
        uVar2 = ForthStack<unsigned_int>::getTop(this_00);
        ForthStack<unsigned_int>::pop(this_00);
        pDVar4 = getDefinition(this,uVar2);
        Definition::Definition(&definition,pDVar4);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&definition.name,&newWord);
        for (sVar5 = 0; definition.name._M_string_length != sVar5; sVar5 = sVar5 + 1) {
          cVar1 = definition.name._M_dataplus._M_p[sVar5];
          cVar6 = cVar1 + -0x20;
          if (0x19 < (byte)(cVar1 + 0x9fU)) {
            cVar6 = cVar1;
          }
          definition.name._M_dataplus._M_p[sVar5] = cVar6;
        }
        std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>::
        emplace_back<cppforth::Forth::Definition>(&this->definitions,&definition);
        index = (int)(((long)(this->definitions).
                             super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->definitions).
                            super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x50) - 1;
        pDVar4 = getDefinition(this,index);
        pDVar4->numberInVector = index;
        std::__cxx11::string::~string((string *)&definition.name);
      }
      std::__cxx11::string::~string((string *)&currentWord);
    }
    std::__cxx11::string::~string((string *)&newWord);
  }
  return;
}

Assistant:

void synonym() {
			bl(); word();
			count();
			auto length = SIZE_T(dStack.getTop()); pop();
			auto caddr = CADDR(dStack.getTop()); pop();
			if (length > 0) {
				std::string newWord{};
				moveFromDataSpace(newWord, caddr, length);
				bl(); word(); dup();
				count();
				length = SIZE_T(dStack.getTop()); pop();
				caddr = CADDR(dStack.getTop()); pop();
				if (length > 0) {
					std::string currentWord{};
					moveFromDataSpace(currentWord, caddr, length);
					find();
					auto found = static_cast<int>(dStack.getTop()); pop();
					if (found) {
						auto xt = XT(dStack.getTop()); pop();
						auto definition = *getDefinition(xt);
						definition.name = newWord;
						for (auto & c: definition.name) c = toupper_ascii(static_cast<unsigned char>(c));
						definitions.emplace_back(std::move(definition));
						getDefinition(CELL(definitions.size()) - 1)->numberInVector = CELL(definitions.size()) - 1;
					}
					else {
						pop(); // remove from stack. not found , ambigous state
					}
				}

			}
		}